

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O1

Value * __thiscall
soul::Value::cloneWithEquivalentType(Value *__return_storage_ptr__,Value *this,Type *newType)

{
  ArrayWithPreallocation<unsigned_char,_8UL> *this_00;
  bool bVar1;
  Type local_48;
  Type local_30;
  
  bVar1 = Type::isEqual(newType,&this->type,0xc);
  if (bVar1) {
    bVar1 = isZero(this);
    local_48.category = newType->category;
    local_48.arrayElementCategory = newType->arrayElementCategory;
    local_48.isRef = newType->isRef;
    local_48.isConstant = newType->isConstant;
    if (bVar1) {
      local_30.primitiveType.type = (newType->primitiveType).type;
      local_30.boundingSize = newType->boundingSize;
      local_30.arrayElementBoundingSize = newType->arrayElementBoundingSize;
      local_30.structure.object = (newType->structure).object;
      (newType->structure).object = (Structure *)0x0;
      local_30._0_4_ = local_48._0_4_;
      Value(__return_storage_ptr__,&local_30);
      RefCountedPtr<soul::Structure>::decIfNotNull(local_30.structure.object);
    }
    else {
      local_48.primitiveType.type = (newType->primitiveType).type;
      local_48.boundingSize = newType->boundingSize;
      local_48.arrayElementBoundingSize = newType->arrayElementBoundingSize;
      local_48.structure.object = (newType->structure).object;
      (newType->structure).object = (Structure *)0x0;
      this_00 = &(this->allocatedData).allocatedData;
      if ((this->allocatedData).allocatedData.numActive == 0) {
        ArrayWithPreallocation<unsigned_char,_8UL>::resize
                  (this_00,(this->allocatedData).allocatedSize);
      }
      Value(__return_storage_ptr__,&local_48,this_00->items);
      RefCountedPtr<soul::Structure>::decIfNotNull(local_48.structure.object);
    }
    return __return_storage_ptr__;
  }
  throwInternalCompilerError("newType.hasIdenticalLayout (type)","cloneWithEquivalentType",0x296);
}

Assistant:

Value Value::cloneWithEquivalentType (Type newType) const
{
    SOUL_ASSERT (newType.hasIdenticalLayout (type));

    if (isZero())
        return Value (std::move (newType));

    return Value (std::move (newType), getPackedData());
}